

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int32_t zng_inflateValidate(zng_stream *strm,int32_t check)

{
  internal_state *piVar1;
  int iVar2;
  int32_t iVar3;
  
  iVar2 = inflateStateCheck(strm);
  iVar3 = -2;
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if ((check == 0) || (*(uint *)&piVar1->pending_out == 0)) {
      *(byte *)&piVar1->pending_out = *(byte *)&piVar1->pending_out & 0xfb;
    }
    else {
      *(uint *)&piVar1->pending_out = *(uint *)&piVar1->pending_out | 4;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateValidate)(PREFIX3(stream) *strm, int32_t check) {
    struct inflate_state *state;

    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;
    if (check && state->wrap)
        state->wrap |= 4;
    else
        state->wrap &= ~4;
    return Z_OK;
}